

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_MACDFIX_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                  int *outNBElement)

{
  TA_RetCode TVar1;
  int *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  double *unaff_retaddr;
  int in_stack_0000000c;
  int in_stack_00000010;
  double *in_stack_00000038;
  double *in_stack_00000040;
  
  TVar1 = TA_MACDFIX(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                     (int *)CONCAT44(in_ESI,in_EDX),in_RCX,(double *)params,in_stack_00000038,
                     in_stack_00000040);
  return TVar1;
}

Assistant:

TA_RetCode TA_MACDFIX_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MACDFIX(
/* Generated */                 startIdx,
/* Generated */                 endIdx,
/* Generated */                 params->in[0].data.inReal, /* inReal */
/* Generated */                 params->optIn[0].data.optInInteger, /* optInSignalPeriod*/
/* Generated */                 outBegIdx, 
/* Generated */                 outNBElement, 
/* Generated */                 params->out[0].data.outReal, /*  outMACD */
/* Generated */                 params->out[1].data.outReal, /*  outMACDSignal */
/* Generated */                 params->out[2].data.outReal /*  outMACDHist */ );
/* Generated */ }